

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

PerThreadSynch * absl::Enqueue(PerThreadSynch *head,SynchWaitParams *waitp,intptr_t mu,int flags)

{
  PerThreadSynch *y;
  long lVar1;
  PerThreadSynch *pPVar2;
  bool bVar3;
  uint uVar4;
  pthread_t __target_thread;
  double dVar5;
  bool local_89;
  byte local_79;
  char *absl_raw_logging_internal_basename_2;
  PerThreadSynch *advance_to;
  char *absl_raw_logging_internal_basename_1;
  sched_param local_58;
  int err;
  sched_param param;
  int policy;
  int64_t now_cycles;
  PerThreadSynch *enqueue_after;
  char *absl_raw_logging_internal_basename;
  PerThreadSynch *s;
  int flags_local;
  intptr_t mu_local;
  SynchWaitParams *waitp_local;
  PerThreadSynch *head_local;
  
  if (waitp->cv_word == (atomic<long> *)0x0) {
    y = waitp->thread;
    local_79 = 1;
    if ((y->waitp != (SynchWaitParams *)0x0) && (local_79 = 1, y->waitp != waitp)) {
      local_79 = y->suppress_fatal_errors;
    }
    if (((local_79 ^ 0xff) & 1) != 0) {
      raw_logging_internal::RawLog
                (kFatal,"mutex.cc",0x387,"Check %s failed: %s",
                 "s->waitp == nullptr || s->waitp == waitp || s->suppress_fatal_errors",
                 "detected illegal recursion into Mutex code");
    }
    y->waitp = waitp;
    y->skip = (PerThreadSynch *)0x0;
    y->may_skip = true;
    y->wake = false;
    y->cond_waiter = (flags & 2U) != 0;
    waitp_local = (SynchWaitParams *)y;
    if (head == (PerThreadSynch *)0x0) {
      y->next = y;
      y->readers = mu;
      y->maybe_unlocking = false;
    }
    else {
      now_cycles = 0;
      _param = base_internal::CycleClock::Now();
      if (y->next_priority_read_cycles < _param) {
        __target_thread = pthread_self();
        uVar4 = pthread_getschedparam(__target_thread,&err,&local_58);
        lVar1 = _param;
        if (uVar4 == 0) {
          y->priority = local_58.__sched_priority;
          dVar5 = base_internal::CycleClock::Frequency();
          y->next_priority_read_cycles = lVar1 + (long)dVar5;
        }
        else {
          raw_logging_internal::RawLog
                    (kError,"mutex.cc",0x39e,"pthread_getschedparam failed: %d",(ulong)uVar4);
        }
      }
      pPVar2 = (PerThreadSynch *)now_cycles;
      if (head->priority < y->priority) {
        absl_raw_logging_internal_basename_2 = (char *)head;
        if ((head->maybe_unlocking & 1U) == 0) {
          do {
            now_cycles = (int64_t)absl_raw_logging_internal_basename_2;
            absl_raw_logging_internal_basename_2 =
                 (char *)Skip(*(PerThreadSynch **)absl_raw_logging_internal_basename_2);
            pPVar2 = (PerThreadSynch *)now_cycles;
          } while (y->priority <= ((PerThreadSynch *)absl_raw_logging_internal_basename_2)->priority
                  );
        }
        else if ((waitp->how == (MuHow)kExclusiveS) &&
                (bVar3 = Condition::GuaranteedEqual(waitp->cond,(Condition *)0x0), pPVar2 = head,
                !bVar3)) {
          pPVar2 = (PerThreadSynch *)now_cycles;
        }
      }
      now_cycles = (int64_t)pPVar2;
      if (now_cycles == 0) {
        y->next = head->next;
        head->next = y;
        y->readers = head->readers;
        y->maybe_unlocking = (bool)(head->maybe_unlocking & 1);
        if (((head->may_skip & 1U) != 0) && (bVar3 = MuEquivalentWaiter(head,y), bVar3)) {
          head->skip = y;
        }
      }
      else {
        y->next = *(PerThreadSynch **)now_cycles;
        *(PerThreadSynch **)now_cycles = y;
        local_89 = true;
        if (*(long *)(now_cycles + 8) != 0) {
          local_89 = MuEquivalentWaiter((PerThreadSynch *)now_cycles,y);
        }
        if (((local_89 ^ 0xffU) & 1) != 0) {
          raw_logging_internal::RawLog
                    (kFatal,"mutex.cc",0x3cd,"Check %s failed: %s",
                     "enqueue_after->skip == nullptr || MuEquivalentWaiter(enqueue_after, s)",
                     "Mutex Enqueue failure");
        }
        if ((((PerThreadSynch *)now_cycles != head) && ((*(byte *)(now_cycles + 0x10) & 1) != 0)) &&
           (bVar3 = MuEquivalentWaiter((PerThreadSynch *)now_cycles,*(PerThreadSynch **)now_cycles),
           bVar3)) {
          *(undefined8 *)(now_cycles + 8) = *(undefined8 *)now_cycles;
        }
        bVar3 = MuEquivalentWaiter(y,y->next);
        waitp_local = (SynchWaitParams *)head;
        if (bVar3) {
          y->skip = y->next;
        }
      }
    }
    std::atomic<absl::base_internal::PerThreadSynch::State>::store
              (&y->state,kQueued,memory_order_relaxed);
    head_local = (PerThreadSynch *)waitp_local;
  }
  else {
    CondVarEnqueue(waitp);
    head_local = head;
  }
  return head_local;
}

Assistant:

static PerThreadSynch *Enqueue(PerThreadSynch *head,
                               SynchWaitParams *waitp, intptr_t mu, int flags) {
  // If we have been given a cv_word, call CondVarEnqueue() and return
  // the previous head of the Mutex waiter queue.
  if (waitp->cv_word != nullptr) {
    CondVarEnqueue(waitp);
    return head;
  }

  PerThreadSynch *s = waitp->thread;
  ABSL_RAW_CHECK(
      s->waitp == nullptr ||    // normal case
          s->waitp == waitp ||  // Fer()---transfer from condition variable
          s->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  s->waitp = waitp;
  s->skip = nullptr;             // maintain skip invariant (see above)
  s->may_skip = true;            // always true on entering queue
  s->wake = false;               // not being woken
  s->cond_waiter = ((flags & kMuIsCond) != 0);
  if (head == nullptr) {         // s is the only waiter
    s->next = s;                 // it's the only entry in the cycle
    s->readers = mu;             // reader count is from mu word
    s->maybe_unlocking = false;  // no one is searching an empty list
    head = s;                    // s is new head
  } else {
    PerThreadSynch *enqueue_after = nullptr;  // we'll put s after this element
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
    int64_t now_cycles = base_internal::CycleClock::Now();
    if (s->next_priority_read_cycles < now_cycles) {
      // Every so often, update our idea of the thread's priority.
      // pthread_getschedparam() is 5% of the block/wakeup time;
      // base_internal::CycleClock::Now() is 0.5%.
      int policy;
      struct sched_param param;
      const int err = pthread_getschedparam(pthread_self(), &policy, &param);
      if (err != 0) {
        ABSL_RAW_LOG(ERROR, "pthread_getschedparam failed: %d", err);
      } else {
        s->priority = param.sched_priority;
        s->next_priority_read_cycles =
            now_cycles +
            static_cast<int64_t>(base_internal::CycleClock::Frequency());
      }
    }
    if (s->priority > head->priority) {  // s's priority is above head's
      // try to put s in priority-fifo order, or failing that at the front.
      if (!head->maybe_unlocking) {
        // No unlocker can be scanning the queue, so we can insert into the
        // middle of the queue.
        //
        // Within a skip chain, all waiters have the same priority, so we can
        // skip forward through the chains until we find one with a lower
        // priority than the waiter to be enqueued.
        PerThreadSynch *advance_to = head;    // next value of enqueue_after
        do {
          enqueue_after = advance_to;
          // (side-effect: optimizes skip chain)
          advance_to = Skip(enqueue_after->next);
        } while (s->priority <= advance_to->priority);
              // termination guaranteed because s->priority > head->priority
              // and head is the end of a skip chain
      } else if (waitp->how == kExclusive &&
                 Condition::GuaranteedEqual(waitp->cond, nullptr)) {
        // An unlocker could be scanning the queue, but we know it will recheck
        // the queue front for writers that have no condition, which is what s
        // is, so an insert at front is safe.
        enqueue_after = head;       // add after head, at front
      }
    }
#endif
    if (enqueue_after != nullptr) {
      s->next = enqueue_after->next;
      enqueue_after->next = s;

      // enqueue_after can be: head, Skip(...), or cur.
      // The first two imply enqueue_after->skip == nullptr, and
      // the last is used only if MuEquivalentWaiter(s, cur).
      // We require this because clearing enqueue_after->skip
      // is impossible; enqueue_after's predecessors might also
      // incorrectly skip over s if we were to allow other
      // insertion points.
      ABSL_RAW_CHECK(enqueue_after->skip == nullptr ||
                         MuEquivalentWaiter(enqueue_after, s),
                     "Mutex Enqueue failure");

      if (enqueue_after != head && enqueue_after->may_skip &&
          MuEquivalentWaiter(enqueue_after, enqueue_after->next)) {
        // enqueue_after can skip to its new successor, s
        enqueue_after->skip = enqueue_after->next;
      }
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                // s may skip to its successor
      }
    } else {   // enqueue not done any other way, so
               // we're inserting s at the back
      // s will become new head; copy data from head into it
      s->next = head->next;        // add s after head
      head->next = s;
      s->readers = head->readers;  // reader count is from previous head
      s->maybe_unlocking = head->maybe_unlocking;  // same for unlock hint
      if (head->may_skip && MuEquivalentWaiter(head, s)) {
        // head now has successor; may skip
        head->skip = s;
      }
      head = s;  // s is new head
    }
  }
  s->state.store(PerThreadSynch::kQueued, std::memory_order_relaxed);
  return head;
}